

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O3

void __thiscall
CVmImageLoaderMres_resload::add_resource
          (CVmImageLoaderMres_resload *this,char *fname,size_t fnamelen,char *res_name,
          size_t res_name_len)

{
  int iVar1;
  char *pcVar2;
  
  if (((this->found_ == 0) && (this->respath_len_ == res_name_len)) &&
     (iVar1 = memicmp(this->respath_,res_name,res_name_len), iVar1 == 0)) {
    this->found_ = 1;
    pcVar2 = lib_copy_str(fname,fnamelen);
    this->link_ = pcVar2;
  }
  return;
}

Assistant:

void add_resource(const char *fname, size_t fnamelen,
                      const char *res_name, size_t res_name_len)
    {
        /* 
         *   if we've already found a match, there's no need to consider
         *   anything else 
         */
        if (found_)
            return;

        /* check to see if this is the one we're looking for */
        if (res_name_len == respath_len_
            && memicmp(respath_, res_name, res_name_len) == 0)
        {
            /* we found it */
            found_ = TRUE;

            /* remember the link */
            link_ = lib_copy_str(fname, fnamelen);
        }
    }